

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::GayBerneAtomTypesSectionParser::parseLine
          (GayBerneAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *AT;
  undefined8 uVar2;
  uint in_ECX;
  RealType in_RDX;
  RealType in_RDI;
  RealType dw;
  GayBerneAdapter gba;
  RealType GB_dw;
  RealType GB_eps_E;
  RealType GB_eps_S;
  RealType GB_eps_X;
  RealType GB_l;
  RealType GB_d;
  AtomType *atomType;
  string atomTypeName;
  RealType dus_;
  RealType eus_;
  int nTokens;
  StringTokenizer tokenizer;
  errorStruct *in_stack_fffffffffffffe40;
  StringTokenizer *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  ForceField *in_stack_fffffffffffffe80;
  StringTokenizer *this_00;
  RealType in_stack_fffffffffffffeb8;
  errorStruct *peVar3;
  undefined4 in_stack_fffffffffffffec0;
  allocator<char> *d;
  GayBerneAdapter in_stack_fffffffffffffee0;
  StringTokenizer *in_stack_fffffffffffffee8;
  string local_e0 [32];
  StringTokenizer *local_c0;
  RealType local_b8;
  int local_b0;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  d = &local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
             (allocator<char> *)in_stack_fffffffffffffe70);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffe50);
  local_b0 = iVar1;
  if (iVar1 < 7) {
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,
             "GayBerneAtomTypesSectionParser: Not enough tokens at line %d\n\tPlease note that GB atoms now require separate specification of epsilon\n\tvalues for cross (X), Side-by-Side (S), and End-to-End (E) for each\n\tellipsoid type.\n"
             ,(ulong)local_1c);
    peVar3->isFatal = 1;
    simError();
  }
  else {
    dw = ForceFieldOptions::getEnergyUnitScaling((ForceFieldOptions *)0x22b37e);
    local_b8 = dw;
    local_c0 = (StringTokenizer *)
               ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x22b3a6);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffee8);
    AT = ForceField::getAtomType(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (AT == (AtomType *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffe40 = &painCave;
      snprintf(painCave.errMsg,2000,
               "GayBerneAtomTypesSectionParser: Can not find matching AtomType %s\n\tfor this GayBerne atom type\n"
               ,uVar2);
      in_stack_fffffffffffffe40->isFatal = 1;
      simError();
    }
    else {
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe80);
      this_00 = local_c0;
      StringTokenizer::nextTokenAsDouble(local_c0);
      StringTokenizer::nextTokenAsDouble(this_00);
      StringTokenizer::nextTokenAsDouble(this_00);
      StringTokenizer::nextTokenAsDouble(this_00);
      StringTokenizer::nextTokenAsDouble(this_00);
      GayBerneAdapter::GayBerneAdapter((GayBerneAdapter *)&stack0xfffffffffffffee0,AT);
      GayBerneAdapter::makeGayBerne
                ((GayBerneAdapter *)in_stack_fffffffffffffee0.at_,(RealType)d,in_RDX,in_RDI,
                 (RealType)CONCAT44(iVar1,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8,dw);
    }
    std::__cxx11::string::~string(local_e0);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffe40);
  return;
}

Assistant:

void GayBerneAtomTypesSectionParser::parseLine(ForceField& ff,
                                                 const std::string& line,
                                                 int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();
    // in GayBerneAtomTypesSection, a line at least contains 7 tokens
    // atomTypeName   d    l    eps_X  eps_S   eps_E   dw
    if (nTokens < 7) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "GayBerneAtomTypesSectionParser: Not enough tokens at line %d\n"
          "\tPlease note that GB atoms now require separate specification of "
          "epsilon\n"
          "\tvalues for cross (X), Side-by-Side (S), and End-to-End (E) for "
          "each\n"
          "\tellipsoid type.\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      RealType eus_            = options_.getEnergyUnitScaling();
      RealType dus_            = options_.getDistanceUnitScaling();
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        RealType GB_d     = dus_ * tokenizer.nextTokenAsDouble();
        RealType GB_l     = dus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_X = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_S = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_E = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_dw    = tokenizer.nextTokenAsDouble();

        GayBerneAdapter gba = GayBerneAdapter(atomType);
        gba.makeGayBerne(GB_d, GB_l, GB_eps_X, GB_eps_S, GB_eps_E, GB_dw);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "GayBerneAtomTypesSectionParser: Can not find matching "
                 "AtomType %s\n"
                 "\tfor this GayBerne atom type\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }